

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

Instr * __thiscall
IRBuilder::BuildProfiledCallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex BVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  JITTimeProfileInfo *pJVar8;
  JITTimeWorkItem *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  BVFixed *pBVar11;
  Func *pFVar12;
  Opnd *pOVar13;
  bool local_5e;
  bool local_5d;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Instr *local_40;
  Instr *callInstr;
  FunctionJITTimeInfo *inlinerData;
  byte local_27;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_26;
  OpCode local_24;
  ArgSlot local_22;
  bool isProtectedByNoProfileBailout;
  RegSlot RStack_20;
  ValueType returnType;
  OpCode newOpcode;
  ArgSlot argCount_local;
  RegSlot function_local;
  RegSlot returnValue_local;
  uint32 offset_local;
  OpCode opcode_local;
  IRBuilder *this_local;
  
  local_22 = argCount;
  RStack_20 = function;
  ValueType::ValueType((ValueType *)&local_26.field_0);
  local_27 = 0;
  local_24 = opcode;
  if (((opcode == ProfiledNewScObject) || (opcode == ProfiledNewScObjectWithICIndex)) ||
     (opcode == ProfiledNewScObjectSpread)) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(&local_24);
    if ((local_24 != NewScObject) && (local_24 != NewScObjectSpread)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x194b,
                         "(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread)"
                         ,
                         "newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = Func::HasProfileInfo(this->m_func);
    if (bVar2) {
      pJVar8 = Func::GetReadOnlyProfileInfo(this->m_func);
      inlinerData._4_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           JITTimeProfileInfo::GetReturnType(pJVar8,opcode,profileId);
      local_26.field_0 = inlinerData._4_2_;
    }
    else {
      inlinerData._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(UninitializedObject);
      local_26.field_0 = inlinerData._6_2_;
    }
    goto LAB_0064e538;
  }
  bVar2 = Func::HasProfileInfo(this->m_func);
  if (bVar2) {
    pJVar8 = Func::GetReadOnlyProfileInfo(this->m_func);
    inlinerData._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         JITTimeProfileInfo::GetReturnType(pJVar8,opcode,profileId);
    local_26.field_0 = inlinerData._2_2_;
  }
  if (ProfiledCallIExtendedFlagsWithICIndex < opcode) goto LAB_0064e538;
  local_24 = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
  bVar2 = DoBailOnNoProfile(this);
  if (!bVar2) goto LAB_0064e538;
  pJVar9 = Func::GetWorkItem(this->m_func);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pJVar9);
  if (pFVar10 != (FunctionJITTimeInfo *)0x0) {
    pJVar9 = Func::GetWorkItem(this->m_func);
    callInstr = (Instr *)JITTimeWorkItem::GetJITTimeInfo(pJVar9);
    bVar2 = IsLoopBody(this);
    if (bVar2) {
      uVar5 = Func::GetSourceContextId(this->m_func);
      uVar6 = Func::GetLocalFunctionId(this->m_func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineInJitLoopBodyPhase,uVar5,uVar6);
      if (!bVar2) goto LAB_0064e3aa;
    }
    else {
LAB_0064e3aa:
      if ((callInstr != (Instr *)0x0) &&
         (pBVar11 = FunctionJITTimeInfo::GetInlineesBV((FunctionJITTimeInfo *)callInstr),
         pBVar11 != (BVFixed *)0x0)) {
        pBVar11 = FunctionJITTimeInfo::GetInlineesBV((FunctionJITTimeInfo *)callInstr);
        BVar4 = BVFixed::Length(pBVar11);
        if (BVar4 <= profileId) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1968,"(profileId < inlinerData->GetInlineesBV()->Length())",
                             "profileId < inlinerData->GetInlineesBV()->Length()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pBVar11 = FunctionJITTimeInfo::GetInlineesBV((FunctionJITTimeInfo *)callInstr);
        BVar3 = BVFixed::Test(pBVar11,(uint)profileId);
        if (BVar3 != '\0') {
          pFVar12 = Func::GetTopFunc(this->m_func);
          uVar5 = Func::GetSourceContextId(pFVar12);
          pFVar12 = Func::GetTopFunc(this->m_func);
          uVar6 = Func::GetLocalFunctionId(pFVar12);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea7040,BailOnNoProfilePhase,uVar5,uVar6);
          if ((!bVar2) ||
             ((-1 < (int)DAT_01eafdc8 && (this->m_func->m_callSiteCount < DAT_01eafdc8))))
          goto LAB_0064e502;
        }
        InsertBailOnNoProfile(this,offset);
        local_27 = 1;
      }
    }
LAB_0064e502:
    if ((local_27 & 1) == 0) {
      this->callTreeHasSomeProfileInfo = true;
    }
  }
  this->m_func->m_callSiteCount = this->m_func->m_callSiteCount + 1;
LAB_0064e538:
  local_40 = BuildCallI_Helper(this,local_24,offset,returnValue,RStack_20,local_22,profileId,flags,
                               inlineCacheIndex);
  local_40->field_0x38 = local_40->field_0x38 & 0xfe | local_27 & 1;
  pOVar13 = IR::Instr::GetDst(local_40);
  local_5d = false;
  if (pOVar13 != (Opnd *)0x0) {
    pOVar13 = IR::Instr::GetDst(local_40);
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(pOVar13);
    bVar2 = ValueType::IsUninitialized((ValueType *)&local_42.field_0);
    local_5e = true;
    if (!bVar2) {
      pOVar13 = IR::Instr::GetDst(local_40);
      local_44.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(pOVar13);
      local_5e = ValueType::operator==
                           ((ValueType *)&local_44.field_0,ValueType::UninitializedObject);
    }
    local_5d = local_5e;
  }
  if (local_5d != false) {
    pOVar13 = IR::Instr::GetDst(local_40);
    IR::Opnd::SetValueType(pOVar13,(ValueType)local_26.field_0);
  }
  return local_40;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledCallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    Js::OpCode newOpcode;
    ValueType returnType;
    bool isProtectedByNoProfileBailout = false;

    if (opcode == Js::OpCode::ProfiledNewScObject || opcode == Js::OpCode::ProfiledNewScObjectWithICIndex
        || opcode == Js::OpCode::ProfiledNewScObjectSpread)
    {
        newOpcode = opcode;
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        Assert(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread);
        if (!this->m_func->HasProfileInfo())
        {
            returnType = ValueType::GetObject(ObjectType::UninitializedObject);
        }
        else
        {
            // If we have profile data, make use of it
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }
    }
    else
    {
        if (this->m_func->HasProfileInfo())
        {
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }

        if (opcode < Js::OpCode::ProfiledReturnTypeCallI)
        {
            newOpcode = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
            if(DoBailOnNoProfile())
            {
                if(this->m_func->GetWorkItem()->GetJITTimeInfo())
                {
                    const FunctionJITTimeInfo *inlinerData = this->m_func->GetWorkItem()->GetJITTimeInfo();
                    if (!(this->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func))
                        && inlinerData && inlinerData->GetInlineesBV())
                    {
                        AssertOrFailFast(profileId < inlinerData->GetInlineesBV()->Length());
                        if (!inlinerData->GetInlineesBV()->Test(profileId)
#if DBG
                            || (PHASE_STRESS(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc())
                                && (CONFIG_FLAG(SkipFuncCountForBailOnNoProfile) < 0
                                    || this->m_func->m_callSiteCount >= (uint)CONFIG_FLAG(SkipFuncCountForBailOnNoProfile)))
#endif
                            )
                        {
                            this->InsertBailOnNoProfile(offset);
                            isProtectedByNoProfileBailout = true;
                        }
                    }

                    if (!isProtectedByNoProfileBailout)
                    {
                        this->callTreeHasSomeProfileInfo = true;
                    }
                }
#if DBG
                this->m_func->m_callSiteCount++;
#endif
            }
        }
        else
        {
            // Changing this opcode into a non ReturnTypeCall* opcode is done in BuildCallI_Helper
            newOpcode = opcode;
        }
    }
    IR::Instr * callInstr = BuildCallI_Helper(newOpcode, offset, returnValue, function, argCount, profileId, flags, inlineCacheIndex);
    callInstr->isCallInstrProtectedByNoProfileBailout = isProtectedByNoProfileBailout;

    if (callInstr->GetDst() && (callInstr->GetDst()->GetValueType().IsUninitialized() || callInstr->GetDst()->GetValueType() == ValueType::UninitializedObject))
    {
        callInstr->GetDst()->SetValueType(returnType);
    }
    return callInstr;
}